

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

char * S2BooleanOperation::OpTypeToString(OpType op_type)

{
  char *pcStack_10;
  OpType op_type_local;
  
  switch(op_type) {
  case UNION:
    pcStack_10 = "UNION";
    break;
  case INTERSECTION:
    pcStack_10 = "INTERSECTION";
    break;
  case DIFFERENCE:
    pcStack_10 = "DIFFERENCE";
    break;
  case SYMMETRIC_DIFFERENCE:
    pcStack_10 = "SYMMETRIC DIFFERENCE";
    break;
  default:
    pcStack_10 = "Unknown OpType";
  }
  return pcStack_10;
}

Assistant:

const char* S2BooleanOperation::OpTypeToString(OpType op_type) {
  switch (op_type) {
    case OpType::UNION:                return "UNION";
    case OpType::INTERSECTION:         return "INTERSECTION";
    case OpType::DIFFERENCE:           return "DIFFERENCE";
    case OpType::SYMMETRIC_DIFFERENCE: return "SYMMETRIC DIFFERENCE";
    default:                           return "Unknown OpType";
  }
}